

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RBBISetBuilder::buildTrie(RBBISetBuilder *this)

{
  UBool UVar1;
  UTrie2 *pUVar2;
  bool bVar3;
  RangeDescriptor *local_18;
  RangeDescriptor *rlRange;
  RBBISetBuilder *this_local;
  
  pUVar2 = utrie2_open_63(0,0,this->fStatus);
  this->fTrie = pUVar2;
  local_18 = this->fRangeList;
  while( true ) {
    bVar3 = false;
    if (local_18 != (RangeDescriptor *)0x0) {
      UVar1 = ::U_SUCCESS(*this->fStatus);
      bVar3 = UVar1 != '\0';
    }
    if (!bVar3) break;
    utrie2_setRange32_63
              (this->fTrie,local_18->fStartChar,local_18->fEndChar,local_18->fNum,'\x01',
               this->fStatus);
    local_18 = local_18->fNext;
  }
  return;
}

Assistant:

void RBBISetBuilder::buildTrie() {
    RangeDescriptor *rlRange;

    fTrie = utrie2_open(0,       //  Initial value for all code points.
                        0,       //  Error value for out-of-range input.
                        fStatus);

    for (rlRange = fRangeList; rlRange!=0 && U_SUCCESS(*fStatus); rlRange=rlRange->fNext) {
        utrie2_setRange32(fTrie,
                          rlRange->fStartChar,     // Range start
                          rlRange->fEndChar,       // Range end (inclusive)
                          rlRange->fNum,           // value for range
                          TRUE,                    // Overwrite previously written values
                          fStatus);
    }
}